

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLElement::DeleteAttribute(XMLElement *this,char *name)

{
  MemPool *pMVar1;
  long lVar2;
  char *pcVar3;
  XMLAttribute **ppXVar4;
  XMLAttribute *pXVar5;
  long lVar6;
  XMLAttribute *pXVar7;
  XMLAttribute *pXVar8;
  bool bVar9;
  bool bVar10;
  
  pXVar8 = this->_rootAttribute;
  if (pXVar8 == (XMLAttribute *)0x0) {
    return;
  }
  pcVar3 = StrPair::GetStr(&pXVar8->_name);
  if (pcVar3 == name) {
    pXVar5 = (XMLAttribute *)0x0;
  }
  else {
    pXVar5 = (XMLAttribute *)0x0;
    pXVar7 = pXVar8;
    do {
      bVar9 = *name == '\0';
      if ((bVar9) || (*name != *pcVar3)) {
        bVar10 = false;
      }
      else {
        lVar2 = 1;
        do {
          lVar6 = lVar2;
          bVar9 = name[lVar6] == '\0';
          if ((bVar9) || (name[lVar6] != pcVar3[lVar6])) break;
          lVar2 = lVar6 + 1;
        } while ((int)lVar6 != 0x7fffffff);
        bVar10 = (int)lVar6 == 0x7fffffff;
        pcVar3 = pcVar3 + lVar6;
      }
      pXVar8 = pXVar7;
      if ((bVar10) || ((bVar9 && (*pcVar3 == '\0')))) break;
      pXVar8 = pXVar7->_next;
      if (pXVar8 == (XMLAttribute *)0x0) {
        return;
      }
      pcVar3 = StrPair::GetStr(&pXVar8->_name);
      pXVar5 = pXVar7;
      pXVar7 = pXVar8;
    } while (pcVar3 != name);
  }
  ppXVar4 = &pXVar5->_next;
  if (pXVar5 == (XMLAttribute *)0x0) {
    ppXVar4 = &this->_rootAttribute;
  }
  *ppXVar4 = pXVar8->_next;
  pMVar1 = pXVar8->_memPool;
  (**pXVar8->_vptr_XMLAttribute)(pXVar8);
  (*pMVar1->_vptr_MemPool[4])(pMVar1,pXVar8);
  return;
}

Assistant:

void XMLElement::DeleteAttribute( const char* name )
{
    XMLAttribute* prev = 0;
    for( XMLAttribute* a=_rootAttribute; a; a=a->_next ) {
        if ( XMLUtil::StringEqual( name, a->Name() ) ) {
            if ( prev ) {
                prev->_next = a->_next;
            }
            else {
                _rootAttribute = a->_next;
            }
            DeleteAttribute( a );
            break;
        }
        prev = a;
    }
}